

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MineFusing.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::MineFusing::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,MineFusing *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"MineFusing:",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tPrimary Fuse:            ",0x1b)
  ;
  ENUMS::GetEnumAsStringMineFuse_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((this->m_FuseUnion).m_ui16Fusing & 0x7f),Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tSecondary Fuse:          ",0x1b);
  ENUMS::GetEnumAsStringMineFuse_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)(*(uint *)&this->m_FuseUnion >> 7 & 0x7f),Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tAnti-Handling Device:    ",0x1b);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString MineFusing::GetAsString() const
{
    KStringStream ss;

    ss << "MineFusing:"
       << "\n\tPrimary Fuse:            " << GetEnumAsStringMineFuse( m_FuseUnion.m_ui16Primary )
       << "\n\tSecondary Fuse:          " << GetEnumAsStringMineFuse( m_FuseUnion.m_ui16Secondary )
       << "\n\tAnti-Handling Device:    " << m_FuseUnion.m_ui16AHD
       << "\n";

    return ss.str();
}